

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face_from_indices.h
# Opt level: O3

Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* __thiscall
Gudhi::coxeter_triangulation::
face_from_indices<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *__return_storage_ptr__,coxeter_triangulation *this,
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *simplex,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  OrderedSetPartition *this_00;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  int *piVar2;
  unsigned_long *puVar3;
  iterator iVar4;
  pointer piVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer puVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  pointer pvVar13;
  unsigned_long *puVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  part_index j;
  unsigned_long local_68;
  coxeter_triangulation *local_60;
  ulong local_58;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = *(long *)this;
  local_48 = *(long *)(this + 8);
  local_60 = this;
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->vertex_,(vector<int,_std::allocator<int>_> *)this);
  uVar17 = (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  this_00 = &__return_storage_ptr__->partition_;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,uVar17);
  local_38 = *(long *)(local_60 + 0x20) - *(long *)(local_60 + 0x18);
  puVar10 = (uint *)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_50 = simplex;
  if (1 < uVar17) {
    uVar11 = 1;
    local_58 = uVar17;
    do {
      uVar17 = (ulong)puVar10[uVar11 - 1];
      if (puVar10[uVar11 - 1] < puVar10[uVar11]) {
        do {
          puVar14 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + uVar17 * 0x18);
          puVar3 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + 8 + uVar17 * 0x18);
          if (puVar14 != puVar3) {
            do {
              local_68 = *puVar14;
              pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                       ((this_00->
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + (uVar11 - 1));
              iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
              if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_68);
              }
              else {
                *iVar4._M_current = local_68;
                *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar3);
            puVar10 = (uint *)(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < puVar10[uVar11]);
      }
      uVar11 = uVar11 + 1;
      uVar17 = local_58;
    } while (uVar11 != local_58);
  }
  uVar11 = (local_38 >> 3) * -0x5555555555555555;
  uVar15 = (ulong)puVar10[uVar17 - 1];
  uVar17 = uVar17 - 1;
  if (uVar15 <= uVar11 && uVar11 - uVar15 != 0) {
    local_58 = uVar17;
    do {
      puVar3 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + 8 + uVar15 * 0x18);
      for (puVar14 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + uVar15 * 0x18);
          puVar14 != puVar3; puVar14 = puVar14 + 1) {
        local_68 = *puVar14;
        pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((this_00->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar17);
        iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
        if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_68);
        }
        else {
          *iVar4._M_current = local_68;
          *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
        }
      }
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (uVar15 < uVar11);
    puVar10 = (uint *)(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    uVar17 = local_58;
  }
  uVar9 = *puVar10;
  if (uVar9 != 0) {
    uVar16 = local_48 - local_40 >> 2;
    uVar11 = 0;
    do {
      puVar14 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + uVar11 * 0x18);
      puVar3 = *(unsigned_long **)(*(long *)(local_60 + 0x18) + 8 + uVar11 * 0x18);
      if (puVar14 != puVar3) {
        do {
          local_68 = *puVar14;
          if (local_68 == uVar16) {
            if (local_48 != local_40) {
              piVar5 = (__return_storage_ptr__->vertex_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              lVar12 = 0;
              do {
                piVar2 = piVar5 + lVar12;
                *piVar2 = *piVar2 + -1;
                lVar12 = lVar12 + 1;
              } while (uVar16 + (uVar16 == 0) != lVar12);
            }
          }
          else {
            piVar2 = (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_68;
            *piVar2 = *piVar2 + 1;
          }
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ((this_00->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar17);
          iVar4._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar4._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar4,&local_68);
          }
          else {
            *iVar4._M_current = local_68;
            *(unsigned_long **)(pvVar1 + 8) = iVar4._M_current + 1;
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar3);
        uVar9 = *(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar9);
  }
  pvVar6 = (__return_storage_ptr__->partition_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar13 = (__return_storage_ptr__->partition_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar13 != pvVar6; pvVar13 = pvVar13 + 1
      ) {
    puVar7 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar7 != puVar8) {
      uVar17 = (long)puVar8 - (long)puVar7 >> 3;
      lVar12 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar8,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Permutahedral_representation face_from_indices(const Permutahedral_representation& simplex,
                                               const Index_range& indices) {
  using range_index = typename Index_range::value_type;
  using Ordered_set_partition = typename Permutahedral_representation::OrderedSetPartition;
  using Part = typename Ordered_set_partition::value_type;
  using part_index = typename Part::value_type;
  Permutahedral_representation value;
  std::size_t d = simplex.vertex().size();
  value.vertex() = simplex.vertex();
  std::size_t k = indices.size() - 1;
  value.partition().resize(k + 1);
  std::size_t l = simplex.partition().size() - 1;
  for (std::size_t h = 1; h < k + 1; h++)
    for (range_index i = indices[h - 1]; i < indices[h]; i++)
      for (part_index j : simplex.partition()[i]) value.partition()[h - 1].push_back(j);
  for (range_index i = indices[k]; i < l + 1; i++)
    for (part_index j : simplex.partition()[i]) value.partition()[k].push_back(j);
  for (range_index i = 0; i < indices[0]; i++)
    for (part_index j : simplex.partition()[i]) {
      if (j != d)
        value.vertex()[j]++;
      else
        for (std::size_t l = 0; l < d; l++) value.vertex()[l]--;
      value.partition()[k].push_back(j);
    }
  // sort the values in each part (probably not needed)
  for (auto& part : value.partition()) std::sort(part.begin(), part.end());
  return value;
}